

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# biomenoise.c
# Opt level: O3

int genNetherScaled(NetherNoise *nn,int *out,Range r,int mc,uint64_t sha)

{
  Range RVar1;
  Range r_00;
  Range r_01;
  undefined1 auVar2 [12];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int y;
  ulong uVar6;
  int *out_00;
  int iVar7;
  ulong uVar8;
  int iVar9;
  ulong uVar10;
  long lVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Range s;
  undefined4 in_stack_ffffffffffffff84;
  int local_70;
  int local_6c;
  NetherNoise *local_68;
  int local_5c;
  undefined4 local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int local_44;
  undefined4 uStack_40;
  uint64_t local_38;
  
  RVar1 = r;
  auVar3 = _DAT_0012dd60;
  if (r.scale < 1) {
    r.scale = 4;
  }
  if (r.sy == 0) {
    r.sy = 1;
  }
  uVar6 = (ulong)r.sx;
  uVar8 = (ulong)r.sz;
  uVar10 = uVar6 * uVar8 * (long)r.sy;
  if (mc < 0x13) {
    if (uVar10 != 0) {
      lVar11 = uVar10 - 1;
      auVar12._8_4_ = (int)lVar11;
      auVar12._0_8_ = lVar11;
      auVar12._12_4_ = (int)((ulong)lVar11 >> 0x20);
      uVar6 = 0;
      auVar12 = auVar12 ^ _DAT_0012dd60;
      auVar13 = _DAT_0012dd40;
      auVar14 = _DAT_0012dd50;
      do {
        auVar15 = auVar14 ^ auVar3;
        iVar7 = auVar12._4_4_;
        if ((bool)(~(auVar15._4_4_ == iVar7 && auVar12._0_4_ < auVar15._0_4_ ||
                    iVar7 < auVar15._4_4_) & 1)) {
          out[uVar6] = 8;
        }
        if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
            auVar15._12_4_ <= auVar12._12_4_) {
          out[uVar6 + 1] = 8;
        }
        auVar15 = auVar13 ^ auVar3;
        iVar4 = auVar15._4_4_;
        if (iVar4 <= iVar7 && (iVar4 != iVar7 || auVar15._0_4_ <= auVar12._0_4_)) {
          out[uVar6 + 2] = 8;
          out[uVar6 + 3] = 8;
        }
        uVar6 = uVar6 + 4;
        lVar11 = auVar14._8_8_;
        auVar14._0_8_ = auVar14._0_8_ + 4;
        auVar14._8_8_ = lVar11 + 4;
        lVar11 = auVar13._8_8_;
        auVar13._0_8_ = auVar13._0_8_ + 4;
        auVar13._8_8_ = lVar11 + 4;
      } while ((uVar10 + 3 & 0xfffffffffffffffc) != uVar6);
    }
  }
  else {
    local_68 = nn;
    local_38 = sha;
    if (r.scale != 1) {
      RVar1.x = r.x;
      RVar1.scale = r.scale;
      RVar1.z = r.z;
      RVar1.sx = r.sx;
      RVar1.sz = r.sz;
      RVar1.y = r.y;
      RVar1.sy = r.sy;
      iVar7 = mapNether3D(nn,out,RVar1,1.0);
      return iVar7;
    }
    r_01.sz = r.sy;
    r_01.sx = r.y;
    auVar2 = RVar1._8_12_;
    r_01.scale = auVar2._0_4_;
    r_01.x = auVar2._4_4_;
    r_01.z = auVar2._8_4_;
    r_01.y = in_stack_ffffffffffffff84;
    r_01.sy = r.sy;
    iVar7 = r.sy;
    getVoronoiSrcRange(r_01);
    out_00 = (int *)0x0;
    if (1 < uVar10) {
      out_00 = out + uVar10;
      r_00.x = iStack_54;
      r_00.scale = local_58;
      r_00.sy = uStack_40;
      r_00.y = local_44;
      r_00.z = iStack_50;
      r_00.sx = iStack_4c;
      r_00.sz = local_48;
      iVar4 = mapNether3D(local_68,out_00,r_00,1.0);
      if (iVar4 != 0) {
        return 1;
      }
    }
    if (iVar7 < 1) {
      return 0;
    }
    iVar4 = 0;
    do {
      if (0 < (int)uVar8) {
        iVar9 = 0;
        do {
          if (0 < (int)uVar6) {
            iVar7 = 0;
            do {
              voronoiAccess3D(local_38,r.x + iVar7,r.y + iVar4,r.z + iVar9,&local_6c,&local_5c,
                              &local_70);
              if (out_00 == (int *)0x0) {
                iVar5 = getNetherBiome(local_68,local_6c,y,local_70,(float *)0x0);
              }
              else {
                iVar5 = out_00[((long)local_48 * ((long)local_5c - (long)local_44) +
                               ((long)local_70 - (long)iStack_50)) * (long)iStack_4c +
                               ((long)local_6c - (long)iStack_54)];
              }
              *out = iVar5;
              out = out + 1;
              iVar7 = iVar7 + 1;
              uVar6 = (ulong)(uint)r.sx;
            } while (iVar7 < r.sx);
            uVar8 = (ulong)(uint)r.sz;
          }
          iVar9 = iVar9 + 1;
          iVar7 = r.sy;
        } while (iVar9 < (int)uVar8);
      }
      iVar4 = iVar4 + 1;
    } while (iVar4 < iVar7);
  }
  return 0;
}

Assistant:

int genNetherScaled(const NetherNoise *nn, int *out, Range r, int mc, uint64_t sha)
{
    if (r.scale <= 0) r.scale = 4;
    if (r.sy == 0) r.sy = 1;

    uint64_t siz = (uint64_t)r.sx*r.sy*r.sz;

    if (mc <= MC_1_15)
    {
        uint64_t i;
        for (i = 0; i < siz; i++)
            out[i] = nether_wastes;
        return 0;
    }

    if (r.scale == 1)
    {
        Range s = getVoronoiSrcRange(r);
        int *src;
        if (siz > 1)
        {   // the source range is large enough that we can try optimizing
            src = out + siz;
            int err = mapNether3D(nn, src, s, 1.0);
            if (err)
                return err;
        }
        else
        {
            src = NULL;
        }

        int i, j, k;
        int *p = out;
        for (k = 0; k < r.sy; k++)
        {
            for (j = 0; j < r.sz; j++)
            {
                for (i = 0; i < r.sx; i++)
                {
                    int x4, z4, y4;
                    voronoiAccess3D(sha, r.x+i, r.y+k, r.z+j, &x4, &y4, &z4);
                    if (src)
                    {
                        x4 -= s.x; y4 -= s.y; z4 -= s.z;
                        *p = src[(int64_t)y4*s.sx*s.sz + (int64_t)z4*s.sx + x4];
                    }
                    else
                    {
                        *p = getNetherBiome(nn, x4, y4, z4, NULL);
                    }
                    p++;
                }
            }
        }
        return 0;
    }
    else
    {
        return mapNether3D(nn, out, r, 1.0);
    }
}